

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiListClipperData::Reset(ImGuiListClipperData *this,ImGuiListClipper *clipper)

{
  this->ListClipper = clipper;
  this->StepNo = 0;
  this->ItemsFrozen = 0;
  ImVector<ImGuiListClipperRange>::resize(&this->Ranges,0);
  return;
}

Assistant:

void                            Reset(ImGuiListClipper* clipper) { ListClipper = clipper; StepNo = ItemsFrozen = 0; Ranges.resize(0); }